

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

idx_t duckdb::DBConfig::GetSystemAvailableMemory(FileSystem *fs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  char *__s_00;
  size_t sVar2;
  optional_idx oVar3;
  idx_t iVar4;
  idx_t iVar5;
  optional_idx *this;
  optional_idx cgroup_memory_limit;
  optional_idx memory;
  optional_idx local_518;
  optional_idx local_510;
  DBConfigOptions local_508;
  
  __s = getenv("SLURM_MEM_PER_NODE");
  __s_00 = getenv("SLURM_MEM_PER_CPU");
  if (__s == (char *)0x0) {
    if (__s_00 != (char *)0x0) {
      paVar1 = &local_508.database_path.field_2;
      local_508.database_path._M_dataplus._M_p = (pointer)paVar1;
      sVar2 = strlen(__s_00);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,__s_00,__s_00 + sVar2);
      oVar3 = ParseMemoryLimitSlurm(&local_508.database_path);
      local_518 = oVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508.database_path._M_dataplus._M_p != paVar1) {
        operator_delete(local_508.database_path._M_dataplus._M_p);
      }
      if (oVar3.index != 0xffffffffffffffff) {
        iVar5 = GetSystemMaxThreads(fs);
        iVar4 = optional_idx::GetIndex(&local_518);
        return iVar4 * iVar5;
      }
    }
  }
  else {
    paVar1 = &local_508.database_path.field_2;
    local_508.database_path._M_dataplus._M_p = (pointer)paVar1;
    sVar2 = strlen(__s);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,__s,__s + sVar2);
    oVar3 = ParseMemoryLimitSlurm(&local_508.database_path);
    local_518 = oVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508.database_path._M_dataplus._M_p != paVar1) {
      operator_delete(local_508.database_path._M_dataplus._M_p);
    }
    this = &local_518;
    if (oVar3.index != 0xffffffffffffffff) goto LAB_004cc6df;
  }
  local_518 = CGroups::GetMemoryLimit(fs);
  this = &local_518;
  if (local_518.index == 0xffffffffffffffff) {
    local_510 = FileSystem::GetAvailableMemory();
    if (local_510.index == 0xffffffffffffffff) {
      switchD_005681f0::default(&local_508,0,0x4e8);
      DBConfigOptions::DBConfigOptions(&local_508);
      DBConfigOptions::~DBConfigOptions(&local_508);
      return local_508.maximum_memory;
    }
    this = &local_510;
  }
LAB_004cc6df:
  iVar5 = optional_idx::GetIndex(this);
  return iVar5;
}

Assistant:

idx_t DBConfig::GetSystemAvailableMemory(FileSystem &fs) {
#ifdef __linux__
	// Check SLURM environment variables first
	const char *slurm_mem_per_node = getenv("SLURM_MEM_PER_NODE");
	const char *slurm_mem_per_cpu = getenv("SLURM_MEM_PER_CPU");

	if (slurm_mem_per_node) {
		auto limit = ParseMemoryLimitSlurm(slurm_mem_per_node);
		if (limit.IsValid()) {
			return limit.GetIndex();
		}
	} else if (slurm_mem_per_cpu) {
		auto mem_per_cpu = ParseMemoryLimitSlurm(slurm_mem_per_cpu);
		if (mem_per_cpu.IsValid()) {
			idx_t num_threads = GetSystemMaxThreads(fs);
			return mem_per_cpu.GetIndex() * num_threads;
		}
	}

	// Check cgroup memory limit
	auto cgroup_memory_limit = CGroups::GetMemoryLimit(fs);
	if (cgroup_memory_limit.IsValid()) {
		return cgroup_memory_limit.GetIndex();
	}
#endif

	// System memory detection
	auto memory = FileSystem::GetAvailableMemory();
	if (!memory.IsValid()) {
		return DBConfigOptions().maximum_memory;
	}
	return memory.GetIndex();
}